

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMAttrNSImpl::setName(DOMAttrNSImpl *this,XMLCh *namespaceURI,XMLCh *qualifiedName)

{
  DOMDocument *pDVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  DOMException *pDVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  XMLCh *local_150;
  XMLCh *local_148;
  XMLCh *local_138;
  MemoryManager *local_130;
  DOMDocumentImpl *local_120;
  long local_110;
  MemoryManager *local_100;
  MemoryManager *local_f0;
  DOMDocumentImpl *local_e0;
  long local_d0;
  MemoryManager *local_c0;
  MemoryManager *local_b0;
  DOMDocumentImpl *local_a0;
  long local_90;
  MemoryManager *local_80;
  DOMDocumentImpl *local_70;
  XMLCh *URI;
  bool xmlnsAlone;
  int index;
  XMLCh *xmlnsURI;
  XMLCh *xmlns;
  DOMDocumentImpl *ownerDoc;
  XMLCh *qualifiedName_local;
  XMLCh *namespaceURI_local;
  DOMAttrNSImpl *this_local;
  
  pDVar1 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
  if (pDVar1 == (DOMDocument *)0x0) {
    local_70 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_70 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  }
  pXVar5 = DOMNodeImpl::getXmlnsString();
  local_138 = DOMNodeImpl::getXmlnsURIString();
  pXVar6 = DOMDocumentImpl::getPooledString(local_70,qualifiedName);
  (this->super_DOMAttrImpl).fName = pXVar6;
  iVar4 = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
  if (-1 < iVar4) {
    bVar3 = false;
    if (iVar4 == 0) {
      bVar2 = XMLString::equals((this->super_DOMAttrImpl).fName,pXVar5);
      if (bVar2) {
        bVar3 = XMLString::equals(namespaceURI,local_138);
        if (!bVar3) {
          pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
          if (this == (DOMAttrNSImpl *)0x0) {
            local_c0 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
            if (CONCAT44(extraout_var_01,iVar4) == 0) {
              local_d0 = 0;
            }
            else {
              local_d0 = CONCAT44(extraout_var_01,iVar4) + -8;
            }
            if (local_d0 == 0) {
              local_f0 = XMLPlatformUtils::fgMemoryManager;
            }
            else {
              iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
              if (CONCAT44(extraout_var_02,iVar4) == 0) {
                local_e0 = (DOMDocumentImpl *)0x0;
              }
              else {
                local_e0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_02,iVar4) + -8);
              }
              local_f0 = DOMDocumentImpl::getMemoryManager(local_e0);
            }
            local_c0 = local_f0;
          }
          DOMException::DOMException(pDVar7,0xe,0,local_c0);
          __cxa_throw(pDVar7,&DOMException::typeinfo,DOMException::~DOMException);
        }
        bVar3 = true;
      }
      this->fPrefix = (XMLCh *)0x0;
      this->fLocalName = (this->super_DOMAttrImpl).fName;
    }
    else {
      pXVar5 = DOMDocumentImpl::getPooledNString
                         (local_70,(this->super_DOMAttrImpl).fName,(long)iVar4);
      this->fPrefix = pXVar5;
      pXVar5 = DOMDocumentImpl::getPooledString
                         (local_70,(this->super_DOMAttrImpl).fName + (long)iVar4 + 1);
      this->fLocalName = pXVar5;
      bVar2 = DOMDocumentImpl::isXMLName(local_70,this->fPrefix);
      if ((!bVar2) || (bVar2 = DOMDocumentImpl::isXMLName(local_70,this->fLocalName), !bVar2)) {
        pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this == (DOMAttrNSImpl *)0x0) {
          local_100 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
          if (CONCAT44(extraout_var_03,iVar4) == 0) {
            local_110 = 0;
          }
          else {
            local_110 = CONCAT44(extraout_var_03,iVar4) + -8;
          }
          if (local_110 == 0) {
            local_130 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
            if (CONCAT44(extraout_var_04,iVar4) == 0) {
              local_120 = (DOMDocumentImpl *)0x0;
            }
            else {
              local_120 = (DOMDocumentImpl *)(CONCAT44(extraout_var_04,iVar4) + -8);
            }
            local_130 = DOMDocumentImpl::getMemoryManager(local_120);
          }
          local_100 = local_130;
        }
        DOMException::DOMException(pDVar7,0xe,0,local_100);
        __cxa_throw(pDVar7,&DOMException::typeinfo,DOMException::~DOMException);
      }
    }
    if (!bVar3) {
      if ((namespaceURI == (XMLCh *)0x0) || (local_148 = namespaceURI, *namespaceURI == L'\0')) {
        local_148 = (XMLCh *)0x0;
      }
      local_138 = DOMNodeImpl::mapPrefix(this->fPrefix,local_148,2);
    }
    if (local_138 == (XMLCh *)0x0) {
      local_150 = (XMLCh *)0x0;
    }
    else {
      local_150 = DOMDocumentImpl::getPooledString(local_70,local_138);
    }
    this->fNamespaceURI = local_150;
    return;
  }
  pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this == (DOMAttrNSImpl *)0x0) {
    local_80 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var,iVar4) == 0) {
      local_90 = 0;
    }
    else {
      local_90 = CONCAT44(extraout_var,iVar4) + -8;
    }
    if (local_90 == 0) {
      local_b0 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar4 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_00,iVar4) == 0) {
        local_a0 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_a0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar4) + -8);
      }
      local_b0 = DOMDocumentImpl::getMemoryManager(local_a0);
    }
    local_80 = local_b0;
  }
  DOMException::DOMException(pDVar7,0xe,0,local_80);
  __cxa_throw(pDVar7,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMAttrNSImpl::setName(const XMLCh* namespaceURI, const XMLCh* qualifiedName)
{
    DOMDocumentImpl* ownerDoc = (DOMDocumentImpl *)fParent.fOwnerDocument;
    const XMLCh * xmlns = DOMNodeImpl::getXmlnsString();
    const XMLCh * xmlnsURI = DOMNodeImpl::getXmlnsURIString();
    this->fName = ownerDoc->getPooledString(qualifiedName);

    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    bool xmlnsAlone = false;	//true if attribute name is "xmlns"
    if (index == 0)
    {	//qualifiedName contains no ':'
        if (XMLString::equals(this->fName, xmlns)) {
            if (!XMLString::equals(namespaceURI, xmlnsURI))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
            xmlnsAlone = true;
        }
        fPrefix = 0;
        fLocalName = fName;
    }
    else
    {
        fPrefix = ownerDoc->getPooledNString(fName, index);
        fLocalName = ownerDoc->getPooledString(fName+index+1);

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (!ownerDoc->isXMLName(fPrefix) || !ownerDoc->isXMLName(fLocalName))
            throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    // DOM Level 3: namespace URI is never empty string.
    const XMLCh * URI = xmlnsAlone ? xmlnsURI
        : DOMNodeImpl::mapPrefix
          (
              fPrefix,
              (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
              DOMNode::ATTRIBUTE_NODE
          );
    this -> fNamespaceURI = (URI == 0) ? 0 : ownerDoc->getPooledString(URI);
}